

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.cpp
# Opt level: O0

int zmq::tune_tcp_socket(fd_t s_)

{
  int iVar1;
  int in_EDI;
  int unaff_retaddr;
  fd_t unaff_retaddr_00;
  int rc;
  int nodelay;
  undefined4 local_c [3];
  
  local_c[0] = 1;
  iVar1 = setsockopt(in_EDI,6,1,local_c,4);
  assert_success_or_recoverable(unaff_retaddr_00,unaff_retaddr);
  return iVar1;
}

Assistant:

int zmq::tune_tcp_socket (fd_t s_)
{
    //  Disable Nagle's algorithm. We are doing data batching on 0MQ level,
    //  so using Nagle wouldn't improve throughput in anyway, but it would
    //  hurt latency.
    int nodelay = 1;
    const int rc =
      setsockopt (s_, IPPROTO_TCP, TCP_NODELAY,
                  reinterpret_cast<char *> (&nodelay), sizeof (int));
    assert_success_or_recoverable (s_, rc);
    if (rc != 0)
        return rc;

#ifdef ZMQ_HAVE_OPENVMS
    //  Disable delayed acknowledgements as they hurt latency significantly.
    int nodelack = 1;
    rc = setsockopt (s_, IPPROTO_TCP, TCP_NODELACK, (char *) &nodelack,
                     sizeof (int));
    assert_success_or_recoverable (s_, rc);
#endif
    return rc;
}